

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

BinaryExpr<const_frozen::basic_string<char>_&,_const_char_(&)[12]> * __thiscall
Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
          (BinaryExpr<const_frozen::basic_string<char>_&,_const_char_(&)[12]>
           *__return_storage_ptr__,ExprLhs<frozen::basic_string<char>const&> *this,char (*rhs) [12])

{
  basic_string<char> *pbVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  StringRef local_38;
  
  pbVar1 = *(basic_string<char> **)this;
  if ((pbVar1->size_ == 0xb) && (*pbVar1->data_ == (*rhs)[0])) {
    uVar4 = 0;
    do {
      if (uVar4 == 10) {
        uVar5 = 0xb;
        break;
      }
      lVar2 = uVar4 + 1;
      uVar5 = uVar4 + 1;
      lVar3 = uVar4 + 1;
      uVar4 = uVar5;
    } while (pbVar1->data_[lVar2] == (*rhs)[lVar3]);
    bVar6 = 10 < uVar5;
  }
  else {
    bVar6 = false;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar6;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d1558;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }